

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# win_helper.c
# Opt level: O2

void cpu_set_cwp_sparc64(CPUSPARCState_conflict1 *env,int new_cwp)

{
  uint32_t uVar1;
  
  uVar1 = env->nwindows;
  if (env->cwp == uVar1 - 1) {
    memcpy32(env->regbase,env->regbase + (uVar1 << 4));
    uVar1 = env->nwindows;
  }
  env->cwp = new_cwp;
  if (uVar1 - 1 == new_cwp) {
    memcpy32(env->regbase + (uVar1 << 4),env->regbase);
  }
  env->regwptr = env->regbase + (new_cwp << 4);
  return;
}

Assistant:

void cpu_set_cwp(CPUSPARCState *env, int new_cwp)
{
    /* put the modified wrap registers at their proper location */
    if (env->cwp == env->nwindows - 1) {
        memcpy32(env->regbase, env->regbase + env->nwindows * 16);
    }
    env->cwp = new_cwp;

    /* put the wrap registers at their temporary location */
    if (new_cwp == env->nwindows - 1) {
        memcpy32(env->regbase + env->nwindows * 16, env->regbase);
    }
    env->regwptr = env->regbase + (new_cwp * 16);
}